

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btScaledBvhTriangleMeshShape.cpp
# Opt level: O0

void __thiscall
btScaledBvhTriangleMeshShape::processAllTriangles
          (btScaledBvhTriangleMeshShape *this,btTriangleCallback *callback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  btScalar *pbVar1;
  btVector3 *in_RCX;
  btVector3 *in_RDX;
  long in_RDI;
  btVector3 scaledAabbMax;
  btVector3 scaledAabbMin;
  btVector3 invLocalScaling;
  btScaledTriangleCallback scaledCallback;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  btTriangleCallback *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  btScalar bVar2;
  btScalar local_248;
  btScalar local_200;
  btScalar local_1b8;
  btScalar local_168;
  btScalar local_120;
  btScalar local_d8;
  btVector3 local_8c;
  btVector3 local_7c;
  float local_6c;
  float local_68 [5];
  float local_54;
  btVector3 local_50;
  undefined1 local_40 [32];
  btVector3 *local_20;
  btVector3 *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  btScaledTriangleCallback::btScaledTriangleCallback
            ((btScaledTriangleCallback *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
             ,(btVector3 *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  pbVar1 = btVector3::getX((btVector3 *)(in_RDI + 0x20));
  local_54 = 1.0 / *pbVar1;
  pbVar1 = btVector3::getY((btVector3 *)(in_RDI + 0x20));
  local_68[0] = 1.0 / *pbVar1;
  pbVar1 = btVector3::getZ((btVector3 *)(in_RDI + 0x20));
  local_6c = 1.0 / *pbVar1;
  btVector3::btVector3(&local_50,&local_54,local_68,&local_6c);
  btVector3::btVector3(&local_7c);
  btVector3::btVector3(&local_8c);
  pbVar1 = btVector3::getX((btVector3 *)(in_RDI + 0x20));
  if (*pbVar1 < 0.0) {
    pbVar1 = btVector3::operator_cast_to_float_(local_20);
    local_d8 = *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_d8 = local_d8 * *pbVar1;
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    local_d8 = *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_d8 = local_d8 * *pbVar1;
  }
  pbVar1 = btVector3::operator_cast_to_float_(&local_7c);
  *pbVar1 = local_d8;
  pbVar1 = btVector3::getY((btVector3 *)(in_RDI + 0x20));
  if (*pbVar1 < 0.0) {
    pbVar1 = btVector3::operator_cast_to_float_(local_20);
    local_120 = pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_120 = local_120 * pbVar1[1];
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    local_120 = pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_120 = local_120 * pbVar1[1];
  }
  pbVar1 = btVector3::operator_cast_to_float_(&local_7c);
  pbVar1[1] = local_120;
  pbVar1 = btVector3::getZ((btVector3 *)(in_RDI + 0x20));
  if (*pbVar1 < 0.0) {
    pbVar1 = btVector3::operator_cast_to_float_(local_20);
    local_168 = pbVar1[2];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_168 = local_168 * pbVar1[2];
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    local_168 = pbVar1[2];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_168 = local_168 * pbVar1[2];
  }
  pbVar1 = btVector3::operator_cast_to_float_(&local_7c);
  pbVar1[2] = local_168;
  pbVar1 = btVector3::operator_cast_to_float_(&local_7c);
  pbVar1[3] = 0.0;
  pbVar1 = btVector3::getX((btVector3 *)(in_RDI + 0x20));
  if (0.0 < *pbVar1) {
    pbVar1 = btVector3::operator_cast_to_float_(local_20);
    local_1b8 = *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_1b8 = local_1b8 * *pbVar1;
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    local_1b8 = *pbVar1;
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_1b8 = local_1b8 * *pbVar1;
  }
  pbVar1 = btVector3::operator_cast_to_float_(&local_8c);
  *pbVar1 = local_1b8;
  pbVar1 = btVector3::getY((btVector3 *)(in_RDI + 0x20));
  if (0.0 < *pbVar1) {
    pbVar1 = btVector3::operator_cast_to_float_(local_20);
    local_200 = pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_200 = local_200 * pbVar1[1];
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    local_200 = pbVar1[1];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_200 = local_200 * pbVar1[1];
  }
  pbVar1 = btVector3::operator_cast_to_float_(&local_8c);
  pbVar1[1] = local_200;
  pbVar1 = btVector3::getZ((btVector3 *)(in_RDI + 0x20));
  if (0.0 < *pbVar1) {
    pbVar1 = btVector3::operator_cast_to_float_(local_20);
    bVar2 = pbVar1[2];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_248 = bVar2 * pbVar1[2];
  }
  else {
    pbVar1 = btVector3::operator_cast_to_float_(local_18);
    local_248 = pbVar1[2];
    pbVar1 = btVector3::operator_cast_to_float_(&local_50);
    local_248 = local_248 * pbVar1[2];
  }
  pbVar1 = btVector3::operator_cast_to_float_(&local_8c);
  pbVar1[2] = local_248;
  pbVar1 = btVector3::operator_cast_to_float_(&local_8c);
  pbVar1[3] = 0.0;
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x80))
            (*(long **)(in_RDI + 0x30),local_40,&local_7c,&local_8c);
  btScaledTriangleCallback::~btScaledTriangleCallback((btScaledTriangleCallback *)0x1c28ec);
  return;
}

Assistant:

void	btScaledBvhTriangleMeshShape::processAllTriangles(btTriangleCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	btScaledTriangleCallback scaledCallback(callback,m_localScaling);
	
	btVector3 invLocalScaling(1.f/m_localScaling.getX(),1.f/m_localScaling.getY(),1.f/m_localScaling.getZ());
	btVector3 scaledAabbMin,scaledAabbMax;

	///support negative scaling
	scaledAabbMin[0] = m_localScaling.getX() >= 0. ? aabbMin[0] * invLocalScaling[0] : aabbMax[0] * invLocalScaling[0];
	scaledAabbMin[1] = m_localScaling.getY() >= 0. ? aabbMin[1] * invLocalScaling[1] : aabbMax[1] * invLocalScaling[1];
	scaledAabbMin[2] = m_localScaling.getZ() >= 0. ? aabbMin[2] * invLocalScaling[2] : aabbMax[2] * invLocalScaling[2];
	scaledAabbMin[3] = 0.f;
	
	scaledAabbMax[0] = m_localScaling.getX() <= 0. ? aabbMin[0] * invLocalScaling[0] : aabbMax[0] * invLocalScaling[0];
	scaledAabbMax[1] = m_localScaling.getY() <= 0. ? aabbMin[1] * invLocalScaling[1] : aabbMax[1] * invLocalScaling[1];
	scaledAabbMax[2] = m_localScaling.getZ() <= 0. ? aabbMin[2] * invLocalScaling[2] : aabbMax[2] * invLocalScaling[2];
	scaledAabbMax[3] = 0.f;
	
	
	m_bvhTriMeshShape->processAllTriangles(&scaledCallback,scaledAabbMin,scaledAabbMax);
}